

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

void SynchFaceOrientation(ON_Brep *brep,int fi)

{
  int iVar1;
  ON_BrepFace *pOVar2;
  int *piVar3;
  ON_BrepLoop *pOVar4;
  ON_BrepTrim *pOVar5;
  ON_BrepEdge *pOVar6;
  ON_BrepTrim *pOVar7;
  bool bRev1;
  bool bRev0;
  ON_BrepTrim *trim1;
  ON_BrepTrim *trim0;
  ON_BrepEdge *edge;
  ON_BrepTrim *trim;
  ON_BrepLoop *loop;
  int local_28;
  int lti;
  int fli;
  int flip;
  ON_BrepFace *face;
  int fi_local;
  ON_Brep *brep_local;
  
  pOVar2 = ON_Brep::Face(brep,fi);
  if (pOVar2 != (ON_BrepFace *)0x0) {
    lti = -1;
    for (local_28 = 0; iVar1 = ON_SimpleArray<int>::Count(&pOVar2->m_li), local_28 < iVar1;
        local_28 = local_28 + 1) {
      piVar3 = ON_SimpleArray<int>::operator[](&pOVar2->m_li,local_28);
      pOVar4 = ON_Brep::Loop(brep,*piVar3);
      if (pOVar4 != (ON_BrepLoop *)0x0) {
        for (loop._4_4_ = 0; iVar1 = ON_SimpleArray<int>::Count(&pOVar4->m_ti), loop._4_4_ < iVar1;
            loop._4_4_ = loop._4_4_ + 1) {
          piVar3 = ON_SimpleArray<int>::operator[](&pOVar4->m_ti,loop._4_4_);
          pOVar5 = ON_Brep::Trim(brep,*piVar3);
          if (((pOVar5 != (ON_BrepTrim *)0x0) &&
              (pOVar6 = ON_Brep::Edge(brep,pOVar5->m_ei), pOVar6 != (ON_BrepEdge *)0x0)) &&
             (iVar1 = ON_SimpleArray<int>::Count(&pOVar6->m_ti), iVar1 == 2)) {
            piVar3 = ON_SimpleArray<int>::operator[](&pOVar6->m_ti,0);
            pOVar5 = ON_Brep::Trim(brep,*piVar3);
            piVar3 = ON_SimpleArray<int>::operator[](&pOVar6->m_ti,1);
            pOVar7 = ON_Brep::Trim(brep,*piVar3);
            if ((pOVar5 != (ON_BrepTrim *)0x0) && (pOVar7 != (ON_BrepTrim *)0x0)) {
              if ((pOVar5->m_bRev3d & 1U) == (-(pOVar7->m_bRev3d & 1U) & 1)) {
                if (lti == -1) {
                  lti = 1;
                }
                else if (lti != 1) {
                  return;
                }
              }
              else if (lti == -1) {
                lti = 0;
              }
              else if (lti != 0) {
                return;
              }
            }
          }
        }
      }
    }
    if (lti == 1) {
      pOVar2 = ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&brep->m_F,fi);
      ON_Brep::FlipFace(brep,pOVar2);
    }
  }
  return;
}

Assistant:

static
void SynchFaceOrientation( ON_Brep& brep, int fi )
{
  const ON_BrepFace* face = brep.Face(fi);
  if ( face )
  {
    int flip = -1, fli, lti;
    for ( fli = 0; fli < face->m_li.Count(); fli++ )
    {
      const ON_BrepLoop* loop = brep.Loop( face->m_li[fli] );
      if ( !loop )
        continue;
      for ( lti = 0; lti < loop->m_ti.Count(); lti++ )
      {
        const ON_BrepTrim* trim = brep.Trim( loop->m_ti[lti] );
        if ( !trim )
          continue;
        const ON_BrepEdge* edge = brep.Edge( trim->m_ei );
        if ( !edge )
          continue;
        if ( edge->m_ti.Count() != 2 )
          continue;
        const ON_BrepTrim* trim0 = brep.Trim( edge->m_ti[0] );
        const ON_BrepTrim* trim1 = brep.Trim( edge->m_ti[1] );
        if ( !trim0 || !trim1 )
          continue;
        bool bRev0 = trim0->m_bRev3d ? true : false;
        bool bRev1 = trim1->m_bRev3d ? true : false;
        if ( bRev0 == bRev1 )
        {
          if ( flip == -1 )
            flip = 1;
          else if (flip != 1 )
            return;
        }
        else
        {
          if ( flip == -1 )
            flip = 0;
          else if (flip != 0 )
            return;
        }
      }
    }
    if ( flip == 1 )
      brep.FlipFace(brep.m_F[fi]);
  }
}